

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_between_face_area(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,char *msg)

{
  int iVar1;
  int iVar2;
  REF_CELL pRVar3;
  REF_GEOM pRVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  REF_INT sense;
  REF_GEOM local_1c0;
  int local_1b4;
  REF_CELL local_1b0;
  REF_DBL uv [2];
  REF_INT ncell;
  REF_INT id;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  REF_DBL uv_area21;
  REF_DBL uv_area20;
  REF_DBL uv_area3;
  REF_DBL uv_area2;
  REF_INT cells [2];
  double local_130;
  double local_128;
  REF_DBL uv_area_sign;
  REF_INT nodes3 [27];
  REF_INT nodes2 [27];
  
  pRVar3 = ref_grid->cell[3];
  pRVar4 = ref_grid->geom;
  uVar5 = ref_geom_unique_id(pRVar4,new_node,2,&id);
  if (uVar5 == 0) {
    local_1c0 = pRVar4;
    local_1b4 = node1;
    local_1b0 = pRVar3;
    uVar5 = ref_geom_uv_area_sign(ref_grid,id,&uv_area_sign);
    iVar2 = local_1b4;
    if (uVar5 == 0) {
      uVar5 = ref_cell_list_with2(local_1b0,node0,local_1b4,2,&ncell,cells);
      pRVar3 = local_1b0;
      if (uVar5 == 0) {
        if ((long)ncell != 2) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x3ed,"ref_geom_between_face_area","expected two tri for box2 nodes",2,(long)ncell)
          ;
          return 1;
        }
        uVar5 = ref_cell_nodes(local_1b0,cells[0],nodes2);
        if (uVar5 == 0) {
          uVar5 = ref_cell_nodes(pRVar3,cells[1],nodes3);
          pRVar4 = local_1c0;
          if (uVar5 == 0) {
            uVar5 = ref_geom_uv_area(local_1c0,nodes2,&uv_area2);
            if (uVar5 == 0) {
              local_168 = uv_area2 * uv_area_sign;
              uv_area2 = local_168;
              uVar5 = ref_geom_uv_area(pRVar4,nodes3,&uv_area3);
              if (uVar5 == 0) {
                local_170 = uv_area3 * uv_area_sign;
                iVar1 = local_1b0->node_per;
                for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
                  if (nodes2[lVar6] == node0) {
                    nodes2[lVar6] = new_node;
                  }
                }
                uv_area3 = local_170;
                uVar5 = ref_geom_uv_area(pRVar4,nodes2,&uv_area20);
                if (uVar5 == 0) {
                  local_178 = uv_area20 * uv_area_sign;
                  iVar1 = local_1b0->node_per;
                  for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
                    if (nodes2[lVar6] == new_node) {
                      nodes2[lVar6] = node0;
                    }
                  }
                  for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
                    if (nodes2[lVar6] == iVar2) {
                      nodes2[lVar6] = new_node;
                    }
                  }
                  uv_area20 = local_178;
                  uVar5 = ref_geom_uv_area(pRVar4,nodes2,&uv_area21);
                  if (uVar5 == 0) {
                    local_180 = uv_area21 * uv_area_sign;
                    iVar1 = local_1b0->node_per;
                    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
                      if (nodes2[lVar6] == new_node) {
                        nodes2[lVar6] = iVar2;
                      }
                    }
                    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
                      if (nodes3[lVar6] == node0) {
                        nodes3[lVar6] = new_node;
                      }
                    }
                    uv_area21 = local_180;
                    uVar5 = ref_geom_uv_area(local_1c0,nodes3,&local_128);
                    if (uVar5 == 0) {
                      local_188 = local_128 * uv_area_sign;
                      iVar2 = local_1b0->node_per;
                      for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                        if (nodes3[lVar6] == new_node) {
                          nodes3[lVar6] = node0;
                        }
                      }
                      for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                        if (nodes3[lVar6] == local_1b4) {
                          nodes3[lVar6] = new_node;
                        }
                      }
                      uVar5 = ref_geom_uv_area(local_1c0,nodes3,&local_130);
                      if (uVar5 == 0) {
                        iVar2 = local_1b0->node_per;
                        for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                          if (nodes3[lVar6] == new_node) {
                            nodes3[lVar6] = local_1b4;
                          }
                        }
                        if ((((1e-20 < local_168) && (1e-20 < local_170)) && (0.0 < local_178)) &&
                           (((0.0 < local_180 && (0.0 < local_188)) &&
                            (0.0 < uv_area_sign * local_130)))) {
                          return 0;
                        }
                        printf("%s orig uv area %e %e new %e %e %e %e\n",local_168,local_170,
                               local_178,local_180,local_188,uv_area_sign * local_130,msg);
                        iVar2 = local_1b0->node_per;
                        for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                          if (nodes2[lVar6] == node0) {
                            nodes2[lVar6] = new_node;
                          }
                        }
                        uVar5 = ref_geom_cell_tuv(local_1c0,nodes2[0],nodes2,2,uv,&sense);
                        if (uVar5 == 0) {
                          printf("20uv %.18e %.18e\n",uv[0],uv[1]);
                          uVar5 = ref_geom_cell_tuv(local_1c0,nodes2[1],nodes2,2,uv,&sense);
                          if (uVar5 == 0) {
                            printf("20uv %.18e %.18e\n",uv[0],uv[1]);
                            uVar5 = ref_geom_cell_tuv(local_1c0,nodes2[2],nodes2,2,uv,&sense);
                            if (uVar5 == 0) {
                              printf("20uv %.18e %.18e\n",uv[0],uv[1]);
                              iVar2 = local_1b0->node_per;
                              for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                                if (nodes2[lVar6] == new_node) {
                                  nodes2[lVar6] = node0;
                                }
                              }
                              for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                                if (nodes2[lVar6] == local_1b4) {
                                  nodes2[lVar6] = new_node;
                                }
                              }
                              uVar5 = ref_geom_cell_tuv(local_1c0,nodes2[0],nodes2,2,uv,&sense);
                              if (uVar5 == 0) {
                                printf("21uv %.18e %.18e\n",uv[0],uv[1]);
                                uVar5 = ref_geom_cell_tuv(local_1c0,nodes2[1],nodes2,2,uv,&sense);
                                if (uVar5 == 0) {
                                  printf("21uv %.18e %.18e\n",uv[0],uv[1]);
                                  uVar5 = ref_geom_cell_tuv(local_1c0,nodes2[2],nodes2,2,uv,&sense);
                                  if (uVar5 == 0) {
                                    printf("21uv %.18e %.18e\n",uv[0],uv[1]);
                                    iVar2 = local_1b0->node_per;
                                    for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                                      if (nodes2[lVar6] == new_node) {
                                        nodes2[lVar6] = local_1b4;
                                      }
                                    }
                                    for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                                      if (nodes3[lVar6] == node0) {
                                        nodes3[lVar6] = new_node;
                                      }
                                    }
                                    uVar5 = ref_geom_cell_tuv(local_1c0,nodes3[0],nodes3,2,uv,&sense
                                                             );
                                    if (uVar5 == 0) {
                                      printf("30uv %.18e %.18e\n",uv[0],uv[1]);
                                      uVar5 = ref_geom_cell_tuv(local_1c0,nodes3[1],nodes3,2,uv,
                                                                &sense);
                                      if (uVar5 == 0) {
                                        printf("30uv %.18e %.18e\n",uv[0],uv[1]);
                                        uVar5 = ref_geom_cell_tuv(local_1c0,nodes3[2],nodes3,2,uv,
                                                                  &sense);
                                        if (uVar5 == 0) {
                                          printf("30uv %.18e %.18e\n",uv[0],uv[1]);
                                          iVar2 = local_1b0->node_per;
                                          for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                                            if (nodes3[lVar6] == new_node) {
                                              nodes3[lVar6] = node0;
                                            }
                                          }
                                          for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                                            if (nodes3[lVar6] == local_1b4) {
                                              nodes3[lVar6] = new_node;
                                            }
                                          }
                                          uVar5 = ref_geom_cell_tuv(local_1c0,nodes3[0],nodes3,2,uv,
                                                                    &sense);
                                          if (uVar5 == 0) {
                                            printf("31uv %.18e %.18e\n",uv[0],uv[1]);
                                            uVar5 = ref_geom_cell_tuv(local_1c0,nodes3[1],nodes3,2,
                                                                      uv,&sense);
                                            if (uVar5 == 0) {
                                              printf("31uv %.18e %.18e\n",uv[0],uv[1]);
                                              uVar5 = ref_geom_cell_tuv(local_1c0,nodes3[2],nodes3,2
                                                                        ,uv,&sense);
                                              if (uVar5 == 0) {
                                                printf("31uv %.18e %.18e\n",uv[0],uv[1]);
                                                iVar2 = local_1b0->node_per;
                                                for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
                                                  if (nodes3[lVar6] == new_node) {
                                                    nodes3[lVar6] = local_1b4;
                                                  }
                                                }
                                                return 0;
                                              }
                                              uVar8 = (ulong)uVar5;
                                              pcVar9 = "cell uv0";
                                              uVar7 = 0x448;
                                            }
                                            else {
                                              uVar8 = (ulong)uVar5;
                                              pcVar9 = "cell uv0";
                                              uVar7 = 0x445;
                                            }
                                          }
                                          else {
                                            uVar8 = (ulong)uVar5;
                                            pcVar9 = "cell uv0";
                                            uVar7 = 0x442;
                                          }
                                        }
                                        else {
                                          uVar8 = (ulong)uVar5;
                                          pcVar9 = "cell uv0";
                                          uVar7 = 0x43b;
                                        }
                                      }
                                      else {
                                        uVar8 = (ulong)uVar5;
                                        pcVar9 = "cell uv0";
                                        uVar7 = 0x438;
                                      }
                                    }
                                    else {
                                      uVar8 = (ulong)uVar5;
                                      pcVar9 = "cell uv0";
                                      uVar7 = 0x435;
                                    }
                                  }
                                  else {
                                    uVar8 = (ulong)uVar5;
                                    pcVar9 = "cell uv0";
                                    uVar7 = 0x42d;
                                  }
                                }
                                else {
                                  uVar8 = (ulong)uVar5;
                                  pcVar9 = "cell uv0";
                                  uVar7 = 0x42a;
                                }
                              }
                              else {
                                uVar8 = (ulong)uVar5;
                                pcVar9 = "cell uv0";
                                uVar7 = 0x427;
                              }
                            }
                            else {
                              uVar8 = (ulong)uVar5;
                              pcVar9 = "cell uv0";
                              uVar7 = 0x420;
                            }
                          }
                          else {
                            uVar8 = (ulong)uVar5;
                            pcVar9 = "cell uv0";
                            uVar7 = 0x41d;
                          }
                        }
                        else {
                          uVar8 = (ulong)uVar5;
                          pcVar9 = "cell uv0";
                          uVar7 = 0x41a;
                        }
                      }
                      else {
                        uVar8 = (ulong)uVar5;
                        pcVar9 = "uv area 3 node 1";
                        uVar7 = 0x40b;
                      }
                    }
                    else {
                      uVar8 = (ulong)uVar5;
                      pcVar9 = "uv area 3 node 0";
                      uVar7 = 0x405;
                    }
                  }
                  else {
                    uVar8 = (ulong)uVar5;
                    pcVar9 = "uv area 2 node 1";
                    uVar7 = 0x3fe;
                  }
                }
                else {
                  uVar8 = (ulong)uVar5;
                  pcVar9 = "uv area 2 node 0";
                  uVar7 = 0x3f8;
                }
              }
              else {
                uVar8 = (ulong)uVar5;
                pcVar9 = "uv area 3";
                uVar7 = 0x3f3;
              }
            }
            else {
              uVar8 = (ulong)uVar5;
              pcVar9 = "uv area 2";
              uVar7 = 0x3f1;
            }
          }
          else {
            uVar8 = (ulong)uVar5;
            pcVar9 = "cell nodes";
            uVar7 = 0x3ef;
          }
        }
        else {
          uVar8 = (ulong)uVar5;
          pcVar9 = "cell nodes";
          uVar7 = 0x3ee;
        }
      }
      else {
        uVar8 = (ulong)uVar5;
        pcVar9 = "list";
        uVar7 = 0x3ec;
      }
    }
    else {
      uVar8 = (ulong)uVar5;
      pcVar9 = "uv area sign";
      uVar7 = 0x3ea;
    }
  }
  else {
    uVar8 = (ulong)uVar5;
    pcVar9 = "unique face id";
    uVar7 = 1000;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar7,
         "ref_geom_between_face_area",uVar8,pcVar9);
  return (REF_STATUS)uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_geom_between_face_area(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node,
                                              const char *msg) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT nodes2[REF_CELL_MAX_SIZE_PER];
  REF_INT nodes3[REF_CELL_MAX_SIZE_PER];
  REF_INT type, id, node;
  REF_INT ncell, cells[2];
  REF_DBL uv_area2, uv_area3, uv_area_sign;
  REF_DBL uv_area20, uv_area21;
  REF_DBL uv_area30, uv_area31;

  type = REF_GEOM_FACE;
  RSS(ref_geom_unique_id(ref_geom, new_node, type, &id), "unique face id");

  RSS(ref_geom_uv_area_sign(ref_grid, id, &uv_area_sign), "uv area sign");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");
  RSS(ref_cell_nodes(ref_cell, cells[0], nodes2), "cell nodes");
  RSS(ref_cell_nodes(ref_cell, cells[1], nodes3), "cell nodes");

  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area2), "uv area 2");
  uv_area2 *= uv_area_sign;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area3), "uv area 3");
  uv_area3 *= uv_area_sign;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node0 == nodes2[node]) nodes2[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area20), "uv area 2 node 0");
  uv_area20 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes2[node]) nodes2[node] = node0;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node1 == nodes2[node]) nodes2[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area21), "uv area 2 node 1");
  uv_area21 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes2[node]) nodes2[node] = node1;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node0 == nodes3[node]) nodes3[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area30), "uv area 3 node 0");
  uv_area30 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes3[node]) nodes3[node] = node0;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node1 == nodes3[node]) nodes3[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area31), "uv area 3 node 1");
  uv_area31 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes3[node]) nodes3[node] = node1;

  if (uv_area2 <= 1e-20 || uv_area3 <= 1e-20 || uv_area20 <= 0 ||
      uv_area21 <= 0 || uv_area30 <= 0 || uv_area31 <= 0) {
    REF_DBL uv[2];
    REF_DBL u0 = 0.0, v0 = 0.0;
    REF_INT sense;
    printf("%s orig uv area %e %e new %e %e %e %e\n", msg, uv_area2, uv_area3,
           uv_area20, uv_area21, uv_area30, uv_area31);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes2[node]) nodes2[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[0], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[1], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[2], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes2[node]) nodes2[node] = node0;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes2[node]) nodes2[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[0], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[1], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[2], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes2[node]) nodes2[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes3[node]) nodes3[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[0], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[1], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[2], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes3[node]) nodes3[node] = node0;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes3[node]) nodes3[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[0], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[1], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[2], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes3[node]) nodes3[node] = node1;
  }

  return REF_SUCCESS;
}